

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall phosg::Image::set_channel_width(Image *this,uint8_t new_width)

{
  uint8_t uVar1;
  ushort uVar2;
  uint uVar3;
  void *__ptr;
  undefined8 uVar4;
  byte bVar5;
  size_t z;
  void *pvVar6;
  long lVar7;
  runtime_error *this_00;
  long lVar8;
  ulong uVar9;
  undefined1 uVar10;
  undefined2 uVar11;
  ulong uVar12;
  long lVar13;
  
  bVar5 = new_width * ' ' | (byte)(new_width - 8) >> 3;
  if ((7 < bVar5) || ((0x8bU >> (bVar5 & 0x1f) & 1) == 0)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this_00,"channel width must be 8, 16, 32, or 64");
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar1 = this->channel_width;
  if (uVar1 != new_width) {
    lVar8 = this->height * this->width;
    lVar13 = (ulong)this->has_alpha + 3;
    pvVar6 = malloc((ulong)(new_width >> 3) * lVar13 * lVar8);
    __ptr = (this->data).raw;
    for (lVar7 = 0; lVar13 * lVar8 - lVar7 != 0; lVar7 = lVar7 + 1) {
      switch(uVar1 << 5 | (byte)(uVar1 - 8) >> 3) {
      case 0:
        bVar5 = *(byte *)((long)__ptr + lVar7);
        uVar9 = (ulong)bVar5;
        if (new_width == '@') {
          uVar12 = (ulong)bVar5 << 8 |
                   (ulong)bVar5 << 0x10 |
                   (ulong)bVar5 << 0x18 |
                   uVar9 << 0x20 | uVar9 << 0x28 | uVar9 << 0x30 | uVar9 << 0x38;
LAB_0010947d:
          *(ulong *)((long)pvVar6 + lVar7 * 8) = uVar12 | uVar9;
        }
        else if (new_width == ' ') {
          *(uint *)((long)pvVar6 + lVar7 * 4) =
               (uint)bVar5 << 8 | (uint)bVar5 << 0x10 | (uint)bVar5 << 0x18 | (uint)bVar5;
        }
        else if (new_width == '\x10') {
          *(ushort *)((long)pvVar6 + lVar7 * 2) = CONCAT11(bVar5,bVar5);
        }
        break;
      case 1:
        uVar2 = *(ushort *)((long)__ptr + lVar7 * 2);
        uVar9 = (ulong)uVar2;
        if (new_width == '@') {
          *(ulong *)((long)pvVar6 + lVar7 * 8) =
               (ulong)uVar2 << 0x10 | uVar9 << 0x20 | uVar9 << 0x30 | uVar9;
        }
        else if (new_width == ' ') {
          *(uint *)((long)pvVar6 + lVar7 * 4) = CONCAT22(uVar2,uVar2);
        }
        else if (new_width == '\b') {
          *(char *)((long)pvVar6 + lVar7) = (char)(uVar2 >> 8);
        }
        break;
      case 3:
        uVar3 = *(uint *)((long)__ptr + lVar7 * 4);
        uVar9 = (ulong)uVar3;
        if (new_width == '@') {
          uVar12 = uVar9 << 0x20;
          goto LAB_0010947d;
        }
        if (new_width == '\x10') {
          uVar11 = (undefined2)(uVar3 >> 0x10);
LAB_001094b0:
          *(undefined2 *)((long)pvVar6 + lVar7 * 2) = uVar11;
        }
        else if (new_width == '\b') {
          uVar10 = (undefined1)(uVar3 >> 0x18);
LAB_001093e2:
          *(undefined1 *)((long)pvVar6 + lVar7) = uVar10;
        }
        break;
      case 7:
        uVar4 = *(undefined8 *)((long)__ptr + lVar7 * 8);
        if (new_width == ' ') {
          *(int *)((long)pvVar6 + lVar7 * 4) = (int)((ulong)uVar4 >> 0x20);
        }
        else {
          if (new_width == '\x10') {
            uVar11 = (undefined2)((ulong)uVar4 >> 0x30);
            goto LAB_001094b0;
          }
          if (new_width == '\b') {
            uVar10 = (undefined1)((ulong)uVar4 >> 0x38);
            goto LAB_001093e2;
          }
        }
      }
    }
    free(__ptr);
    (this->data).raw = pvVar6;
    this->channel_width = new_width;
    this->max_value = 0xffffffffffffffff >> (-new_width & 0x3f);
  }
  return;
}

Assistant:

void Image::set_channel_width(uint8_t new_width) {
  if (new_width != 8 && new_width != 16 && new_width != 32 && new_width != 64) {
    throw runtime_error("channel width must be 8, 16, 32, or 64");
  }
  if (this->channel_width == new_width) {
    return;
  }

  DataPtrs new_data;
  new_data.raw = malloc(this->width * this->height * (3 + this->has_alpha) * (new_width / 8));

  size_t value_count = this->width * this->height * (this->has_alpha ? 4 : 3);
  for (size_t z = 0; z < value_count; z++) {
    uint64_t v;
    // If the new channel width is larger than the current width, expand the
    // channels by copying the now-high bits to the lower bits. If the new
    // channel width is smaller, preserve only the high bits of the original
    // values.
    if (this->channel_width == 8) {
      v = this->data.as8[z];
      if (new_width == 16) {
        new_data.as16[z] = (v << 8) | v;
      } else if (new_width == 32) {
        new_data.as32[z] = (v << 24) | (v << 16) | (v << 8) | v;
      } else if (new_width == 64) {
        new_data.as64[z] = (v << 56) | (v << 48) | (v << 40) | (v << 32) | (v << 24) | (v << 16) | (v << 8) | v;
      }

    } else if (this->channel_width == 16) {
      v = this->data.as16[z];
      if (new_width == 8) {
        new_data.as8[z] = v >> 8;
      } else if (new_width == 32) {
        new_data.as32[z] = (v << 16) | v;
      } else if (new_width == 64) {
        new_data.as64[z] = (v << 48) | (v << 32) | (v << 16) | v;
      }

    } else if (this->channel_width == 32) {
      v = this->data.as32[z];
      if (new_width == 8) {
        new_data.as8[z] = v >> 24;
      } else if (new_width == 16) {
        new_data.as16[z] = v >> 16;
      } else if (new_width == 64) {
        new_data.as64[z] = (v << 32) | v;
      }

    } else if (this->channel_width == 64) {
      v = this->data.as64[z];
      if (new_width == 8) {
        new_data.as8[z] = v >> 56;
      } else if (new_width == 16) {
        new_data.as16[z] = v >> 48;
      } else if (new_width == 32) {
        new_data.as32[z] = v >> 32;
      }
    }
  }

  free(this->data.raw);
  this->data.raw = new_data.raw;
  this->channel_width = new_width;
  this->max_value = mask_for_width(this->channel_width);
}